

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db.cpp
# Opt level: O3

bool wallet::IsSQLiteFile(path *path)

{
  string_view source_file;
  char cVar1;
  bool bVar2;
  int iVar3;
  ulong uVar4;
  Logger *pLVar5;
  pointer pcVar6;
  CChainParams *pCVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R9;
  long in_FS_OFFSET;
  string_view str;
  string_view logging_function;
  error_code ec;
  ifstream file;
  char app_id [4];
  size_type __dnew_1;
  char magic [16];
  size_type __dnew;
  string magic_str;
  error_code local_318;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_300 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  int local_d8;
  char acStack_d4 [12];
  long local_c8 [2];
  pointer local_b8 [4];
  undefined8 local_98;
  undefined8 uStack_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  cVar1 = std::filesystem::status((path *)path);
  bVar2 = false;
  if ((cVar1 != '\0') && (bVar2 = false, cVar1 != -1)) {
    local_318._M_value = 0;
    local_318._M_cat = (error_category *)std::_V2::system_category();
    uVar4 = std::filesystem::file_size((path *)path,&local_318);
    if (local_318._M_value != 0) {
      (**(code **)(*(long *)local_318._M_cat + 0x20))(&local_d8);
      pcVar6 = (path->super_path)._M_pathname._M_dataplus._M_p;
      local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_f8,pcVar6,pcVar6 + (path->super_path)._M_pathname._M_string_length
                );
      pLVar5 = LogInstance();
      bVar2 = BCLog::Logger::Enabled(pLVar5);
      if (bVar2) {
        local_300[0]._M_string_length = 0;
        local_300[0].field_2._M_local_buf[0] = '\0';
        local_300[0]._M_dataplus._M_p = (pointer)&local_300[0].field_2;
        tinyformat::format<char[13],std::__cxx11::string,std::__cxx11::string>
                  (&local_58,(tinyformat *)"%s: %s %s\n","IsSQLiteFile",(char (*) [13])&local_d8,
                   &local_f8,in_R9);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                  (local_300,&local_58);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_58._M_dataplus._M_p != &local_58.field_2) {
          operator_delete(local_58._M_dataplus._M_p,
                          (ulong)(local_58.field_2._M_allocated_capacity + 1));
        }
        pLVar5 = LogInstance();
        local_58._M_dataplus._M_p = (pointer)0x56;
        local_58._M_string_length = 0x10f8f06;
        source_file._M_str =
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/db.cpp"
        ;
        source_file._M_len = 0x56;
        str._M_str = local_300[0]._M_dataplus._M_p;
        str._M_len = local_300[0]._M_string_length;
        logging_function._M_str = "IsSQLiteFile";
        logging_function._M_len = 0xc;
        BCLog::Logger::LogPrintStr(pLVar5,str,logging_function,source_file,0x7f,ALL,Info);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_300[0]._M_dataplus._M_p != &local_300[0].field_2) {
          operator_delete(local_300[0]._M_dataplus._M_p,
                          CONCAT71(local_300[0].field_2._M_allocated_capacity._1_7_,
                                   local_300[0].field_2._M_local_buf[0]) + 1);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
        operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
      }
      if ((long *)CONCAT44(acStack_d4._0_4_,local_d8) != local_c8) {
        operator_delete((long *)CONCAT44(acStack_d4._0_4_,local_d8),local_c8[0] + 1);
      }
    }
    if (uVar4 < 0x200) {
      bVar2 = false;
    }
    else {
      std::ifstream::ifstream(local_300,(path->super_path)._M_pathname._M_dataplus._M_p,_S_bin);
      cVar1 = std::__basic_file<char>::is_open();
      if (cVar1 == '\0') {
        bVar2 = false;
      }
      else {
        std::istream::read((char *)local_300,(long)&local_98);
        std::istream::seekg((long)local_300,0x44);
        std::istream::read((char *)local_300,(long)&local_d8);
        std::ifstream::close();
        local_78._M_dataplus._M_p = (char *)0x10;
        local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
        local_58._M_dataplus._M_p =
             std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             _M_create(&local_58,(size_type *)&local_78,0);
        local_58.field_2._M_allocated_capacity = (size_type)local_78._M_dataplus._M_p;
        *(undefined8 *)local_58._M_dataplus._M_p = local_98;
        *(undefined8 *)(local_58._M_dataplus._M_p + 8) = uStack_90;
        local_58._M_string_length = (size_type)local_78._M_dataplus._M_p;
        local_58._M_dataplus._M_p[local_78._M_dataplus._M_p] = '\0';
        local_b8[0] = (char *)0x10;
        local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
        pcVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 _M_create(&local_78,(size_type *)local_b8,0);
        local_78.field_2._M_allocated_capacity = (size_type)local_b8[0];
        builtin_strncpy(pcVar6,"SQLite format 3",0x10);
        local_78._M_string_length = (size_type)local_b8[0];
        pcVar6[(long)local_b8[0]] = '\0';
        local_78._M_dataplus._M_p = pcVar6;
        if ((pointer)local_58._M_string_length == local_b8[0]) {
          if ((char *)local_58._M_string_length == (char *)0x0) {
            bVar2 = true;
          }
          else {
            iVar3 = bcmp(local_58._M_dataplus._M_p,pcVar6,local_58._M_string_length);
            bVar2 = iVar3 == 0;
          }
        }
        else {
          bVar2 = false;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)pcVar6 != &local_78.field_2) {
          operator_delete(pcVar6,(ulong)(local_78.field_2._M_allocated_capacity + 1));
        }
        if (bVar2) {
          pCVar7 = Params();
          bVar2 = *(int *)(pCVar7->pchMessageStart)._M_elems == local_d8;
        }
        else {
          bVar2 = false;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_58._M_dataplus._M_p != &local_58.field_2) {
          operator_delete(local_58._M_dataplus._M_p,
                          (ulong)(local_58.field_2._M_allocated_capacity + 1));
        }
      }
      std::ifstream::~ifstream(local_300);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool IsSQLiteFile(const fs::path& path)
{
    if (!fs::exists(path)) return false;

    // A SQLite Database file is at least 512 bytes.
    std::error_code ec;
    auto size = fs::file_size(path, ec);
    if (ec) LogPrintf("%s: %s %s\n", __func__, ec.message(), fs::PathToString(path));
    if (size < 512) return false;

    std::ifstream file{path, std::ios::binary};
    if (!file.is_open()) return false;

    // Magic is at beginning and is 16 bytes long
    char magic[16];
    file.read(magic, 16);

    // Application id is at offset 68 and 4 bytes long
    file.seekg(68, std::ios::beg);
    char app_id[4];
    file.read(app_id, 4);

    file.close();

    // Check the magic, see https://sqlite.org/fileformat.html
    std::string magic_str(magic, 16);
    if (magic_str != std::string{"SQLite format 3\000", 16}) {
        return false;
    }

    // Check the application id matches our network magic
    return memcmp(Params().MessageStart().data(), app_id, 4) == 0;
}